

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::hufCompress(unsigned_short *raw,int nRaw,char *compressed)

{
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  char *tableEnd;
  longlong freq [65537];
  int hlink [65537];
  _Iter_comp_iter<tinyexr::FHeapCompare> __cmp;
  longlong *in_stack_ffffffffffe3ff98;
  uint auStack_c0048 [65540];
  _Iter_comp_iter<tinyexr::FHeapCompare> a_Stack_80038 [524296];
  
  if (nRaw == 0) {
    iVar10 = 0;
  }
  else {
    memset(&stack0xffffffffffebffa8,0,0x80008);
    if (0 < nRaw) {
      uVar8 = 0;
      do {
        *(long *)(&stack0xffffffffffebffa8 + (ulong)raw[uVar8] * 8) =
             *(long *)(&stack0xffffffffffebffa8 + (ulong)raw[uVar8] * 8) + 1;
        uVar8 = uVar8 + 1;
      } while ((uint)nRaw != uVar8);
    }
    uVar8 = 0xffffffffffffffff;
    plVar6 = (long *)&stack0xffffffffffebffa0;
    do {
      uVar8 = uVar8 + 1;
      plVar1 = plVar6 + 1;
      plVar6 = plVar6 + 1;
    } while (*plVar1 == 0);
    if (uVar8 < 0x10001) {
      uVar11 = 0;
      iVar15 = 0;
      uVar9 = uVar8;
      do {
        auStack_c0048[uVar9] = (uint)uVar9;
        if (*plVar6 != 0) {
          *(long **)(&stack0xffffffffffe3ff98 + (long)iVar15 * 8) = plVar6;
          iVar15 = iVar15 + 1;
          uVar11 = uVar9 & 0xffffffff;
        }
        uVar9 = uVar9 + 1;
        plVar6 = plVar6 + 1;
      } while (uVar9 != 0x10001);
      iVar10 = (int)uVar11 + 1;
    }
    else {
      iVar15 = 0;
      iVar10 = 1;
    }
    *(undefined8 *)(&stack0xffffffffffebffa8 + (long)iVar10 * 8) = 1;
    *(undefined1 **)(&stack0xffffffffffe3ff98 + (long)iVar15 * 8) =
         &stack0xffffffffffebffa8 + (long)iVar10 * 8;
    std::__make_heap<long_long**,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
              ((longlong **)&stack0xffffffffffe3ff98,
               (longlong **)(&stack0xffffffffffe3ffa0 + (long)iVar15 * 8),a_Stack_80038);
    memset(a_Stack_80038,0,0x80008);
    if (0 < iVar15) {
      uVar9 = (ulong)(iVar15 + 1);
      do {
        uVar2 = *(undefined8 *)(&stack0xffffffffffe3ff90 + uVar9 * 8);
        *(longlong **)(&stack0xffffffffffe3ff90 + uVar9 * 8) = in_stack_ffffffffffe3ff98;
        std::
        __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                  (&stack0xffffffffffe3ff98,0,
                   (long)(&stack0xffffffffffe3ff90 + (uVar9 * 8 - (long)&stack0xffffffffffe3ff98))
                   >> 3,uVar2);
        uVar11 = uVar9 - 1;
        if (1 < uVar11) {
          lVar7 = uVar9 * 8;
          uVar2 = *(undefined8 *)(&stack0xffffffffffe3ff88 + lVar7);
          *(longlong **)(&stack0xffffffffffe3ff88 + lVar7) = in_stack_ffffffffffe3ff98;
          std::
          __adjust_heap<long_long**,long,long_long*,__gnu_cxx::__ops::_Iter_comp_iter<tinyexr::FHeapCompare>>
                    (&stack0xffffffffffe3ff98,0,
                     (long)(&stack0xffffffffffe3ff88 + (lVar7 - (long)&stack0xffffffffffe3ff98)) >>
                     3,uVar2);
        }
        uVar16 = (ulong)((long)in_stack_ffffffffffe3ff98 - (long)&stack0xffffffffffebffa8) >> 3;
        uVar14 = (ulong)((long)in_stack_ffffffffffe3ff98 - (long)&stack0xffffffffffebffa8) >> 3;
        *(long *)(&stack0xffffffffffebffa8 + (long)(int)uVar14 * 8) =
             *(long *)(&stack0xffffffffffebffa8 + (long)(int)uVar14 * 8) +
             *(long *)(&stack0xffffffffffebffa8 + (long)(int)(uint)uVar16 * 8);
        plVar6 = *(long **)(&stack0xffffffffffe3ff90 + uVar11 * 8);
        lVar7 = uVar9 - 2;
        if (1 < uVar11) {
          lVar3 = *plVar6;
          do {
            lVar12 = (lVar7 - (lVar7 + -1 >> 0x3f)) + -1 >> 1;
            if (**(long **)(&stack0xffffffffffe3ff98 + lVar12 * 8) <= lVar3) break;
            *(long **)(&stack0xffffffffffe3ff98 + lVar7 * 8) =
                 *(long **)(&stack0xffffffffffe3ff98 + lVar12 * 8);
            bVar4 = 2 < lVar7;
            lVar7 = lVar12;
          } while (bVar4);
        }
        *(long **)(&stack0xffffffffffe3ff98 + lVar7 * 8) = plVar6;
        do {
          uVar13 = (uint)uVar14;
          lVar7 = (long)(int)uVar13;
          *(long *)(a_Stack_80038 + lVar7 * 8) = *(long *)(a_Stack_80038 + lVar7 * 8) + 1;
          uVar14 = (ulong)auStack_c0048[lVar7];
        } while (auStack_c0048[lVar7] != uVar13);
        auStack_c0048[lVar7] = (uint)uVar16;
        do {
          uVar13 = (uint)uVar16;
          *(long *)(a_Stack_80038 + (long)(int)uVar13 * 8) =
               *(long *)(a_Stack_80038 + (long)(int)uVar13 * 8) + 1;
          uVar16 = (ulong)auStack_c0048[(int)uVar13];
        } while (auStack_c0048[(int)uVar13] != uVar13);
        bVar4 = 2 < (long)uVar9;
        uVar9 = uVar11;
      } while (bVar4);
    }
    hufCanonicalCodeTable((longlong *)a_Stack_80038);
    memcpy(&stack0xffffffffffebffa8,a_Stack_80038,0x80008);
    hufPackEncTable((longlong *)&stack0xffffffffffebffa8,(int)uVar8,iVar10,
                    (char **)&stack0xffffffffffe3ff98);
    iVar5 = hufEncode((longlong *)&stack0xffffffffffebffa8,raw,nRaw,iVar10,compressed + 0x14);
    iVar15 = iVar5 + 0xe;
    if (-1 < iVar5 + 7) {
      iVar15 = iVar5 + 7;
    }
    *compressed = (char)uVar8;
    compressed[1] = (char)(uVar8 >> 8);
    compressed[2] = (char)(uVar8 >> 0x10);
    compressed[3] = (char)(uVar8 >> 0x18);
    compressed[4] = (char)iVar10;
    compressed[5] = (char)((uint)iVar10 >> 8);
    compressed[6] = (char)((uint)iVar10 >> 0x10);
    compressed[7] = (char)((uint)iVar10 >> 0x18);
    compressed[8] = '\0';
    compressed[9] = '\0';
    compressed[10] = '\0';
    compressed[0xb] = '\0';
    compressed[0xc] = (char)iVar5;
    compressed[0xd] = (char)((uint)iVar5 >> 8);
    compressed[0xe] = (char)((uint)iVar5 >> 0x10);
    compressed[0xf] = (char)((uint)iVar5 >> 0x18);
    iVar10 = ((int)(compressed + 0x14) + (iVar15 >> 3)) - (int)compressed;
    compressed[0x10] = '\0';
    compressed[0x11] = '\0';
    compressed[0x12] = '\0';
    compressed[0x13] = '\0';
  }
  return iVar10;
}

Assistant:

int hufCompress(const unsigned short raw[], int nRaw, char compressed[]) {
  if (nRaw == 0) return 0;

  long long freq[HUF_ENCSIZE];

  countFrequencies(freq, raw, nRaw);

  int im = 0;
  int iM = 0;
  hufBuildEncTable(freq, &im, &iM);

  char *tableStart = compressed + 20;
  char *tableEnd = tableStart;
  hufPackEncTable(freq, im, iM, &tableEnd);
  int tableLength = tableEnd - tableStart;

  char *dataStart = tableEnd;
  int nBits = hufEncode(freq, raw, nRaw, iM, dataStart);
  int data_length = (nBits + 7) / 8;

  writeUInt(compressed, im);
  writeUInt(compressed + 4, iM);
  writeUInt(compressed + 8, tableLength);
  writeUInt(compressed + 12, nBits);
  writeUInt(compressed + 16, 0);  // room for future extensions

  return dataStart + data_length - compressed;
}